

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_seh.cpp
# Opt level: O0

void testSEH(void)

{
  exception *e_1;
  exception *e;
  
  initTranslator();
  badCallOuter_Nullptr();
  nodecpp::log::default_log::info<char_const*>("... and still working [1]");
  badCallOuter_AnyPtr();
  nodecpp::log::default_log::info<char_const*>("... and still working [2]");
  return;
}

Assistant:

void testSEH()
{
    initTranslator();

    try
    {
		badCallOuter_Nullptr();
    }
    catch (std::exception& e)
    {
        nodecpp::log::default_log::info("{}", e.what() );
    }

    nodecpp::log::default_log::info("... and still working [1]" );

    try
    {
		badCallOuter_AnyPtr();
	}
    catch (std::exception& e)
    {
        nodecpp::log::default_log::info("{}", e.what() );
    }

    nodecpp::log::default_log::info("... and still working [2]" );
	
    /*try 
	{
		badCallOuter_DivByZero();
	}
	catch( std::exception& e )
	{
		nodecpp::log::default_log::info("{}", e.what() );
	}

    nodecpp::log::default_log::info("... and still working [3]" );*/
}